

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

parameter * __thiscall
clipp::detail::action_provider<clipp::parameter>::set<std::__cxx11::string>
          (action_provider<clipp::parameter> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  parameter *ppVar1;
  map_arg_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  arg_action local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  action_provider<clipp::parameter> *this_local;
  
  local_18 = t;
  t_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_40 = clipp::set<std::__cxx11::string>(t);
  std::function<void(char_const*)>::function<clipp::detail::map_arg_to<std::__cxx11::string>,void>
            ((function<void(char_const*)> *)&local_38,&local_40);
  ppVar1 = call(this,&local_38);
  std::function<void_(const_char_*)>::~function(&local_38);
  return ppVar1;
}

Assistant:

Derived&
    set(Target& t) {
        static_assert(!std::is_pointer<Target>::value,
                      "parameter target type must not be a pointer");

        return call(clipp::set(t));
    }